

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fthash.c
# Opt level: O0

FT_Hashnode * hash_bucket(FT_Hashkey key,FT_Hash hash)

{
  FT_Hashnode *ppFVar1;
  FT_Bool FVar2;
  FT_ULong FVar3;
  FT_Hashnode *local_30;
  FT_Hashnode *ndp;
  FT_Hashnode *bp;
  FT_ULong res;
  FT_Hash hash_local;
  FT_Hashkey key_local;
  
  ppFVar1 = hash->table;
  hash_local = (FT_Hash)key;
  FVar3 = (*hash->lookup)((FT_Hashkey *)&hash_local);
  local_30 = ppFVar1 + FVar3 % (ulong)hash->size;
  while ((*local_30 != (FT_Hashnode)0x0 &&
         (FVar2 = (*hash->compare)(&(*local_30)->key,(FT_Hashkey *)&hash_local), FVar2 == '\0'))) {
    local_30 = local_30 + -1;
    if (local_30 < ppFVar1) {
      local_30 = ppFVar1 + (hash->size - 1);
    }
  }
  return local_30;
}

Assistant:

static FT_Hashnode*
  hash_bucket( FT_Hashkey  key,
               FT_Hash     hash )
  {
    FT_ULong      res = 0;
    FT_Hashnode*  bp  = hash->table;
    FT_Hashnode*  ndp;


    res = (hash->lookup)( &key );

    ndp = bp + ( res % hash->size );
    while ( *ndp )
    {
      if ( (hash->compare)( &(*ndp)->key, &key ) )
        break;

      ndp--;
      if ( ndp < bp )
        ndp = bp + ( hash->size - 1 );
    }

    return ndp;
  }